

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::CreateRotationMesh(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  int iVar3;
  TPZMaterial *pTVar4;
  _Rb_tree_node_base *p_Var5;
  TPZCompEl **ppTVar6;
  TPZCompElDisc *this_02;
  TPZGeoEl *pTVar7;
  TPZConnect *pTVar8;
  TPZCompEl *this_03;
  iterator iVar9;
  long lVar10;
  int64_t el;
  int64_t i;
  long lVar11;
  long nelem;
  int it;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  _Rb_tree_color local_84;
  TPZMHMixedMeshControl *local_80;
  TPZGeoMesh *local_78;
  _Base_ptr local_70;
  set<int,_std::less<int>,_std::allocator<int>_> *local_68;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  this_00 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
  TPZGeoMesh::ResetReference(this_00);
  iVar2 = (this->super_TPZMHMeshControl).fpOrderInternal;
  this_01 = ((this->fRotationMesh).fRef)->fPointer;
  local_80 = this;
  local_78 = this_00;
  TPZGeoMesh::ResetReference(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"RotationMesh",(allocator<char> *)&local_84);
  TPZCompMesh::SetName(this_01,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  this_01->fDimModel = local_78->fDim;
  TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous(&this_01->fCreate);
  this_01->fDefaultOrder = iVar2;
  iVar2 = this_01->fDimModel;
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  local_68 = &(local_80->super_TPZMHMeshControl).fMaterialIds;
  p_Var1 = &(local_80->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header;
  local_40 = (_Base_ptr)local_60._24_8_;
  for (p_Var5 = (local_80->super_TPZMHMeshControl).fMaterialIds._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left; (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    local_84 = p_Var5[1]._M_color;
    pTVar4 = TPZCompMesh::FindMaterial(this_01,local_84);
    if (pTVar4 != (TPZMaterial *)0x0) {
      iVar3 = (**(code **)(*(long *)pTVar4 + 0x50))(pTVar4);
      if (iVar3 == iVar2) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_60,(int *)&local_84);
      }
    }
  }
  local_70 = &p_Var1->_M_header;
  (**(code **)(*(long *)this_01 + 0xf8))(this_01,local_60);
  (**(code **)(*(long *)((local_80->fRotationMesh).fRef)->fPointer + 0x60))();
  lVar10 = (this_01->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  lVar11 = 0;
  if (lVar10 < 1) {
    lVar10 = lVar11;
  }
  while( true ) {
    if (lVar10 == lVar11) {
      lVar11 = (this_01->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
      nelem = 0;
      if (lVar11 < 1) {
        lVar11 = nelem;
      }
      for (; lVar11 != nelem; nelem = nelem + 1) {
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this_01->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
        (pTVar8->field_2).fCompose.fLagrangeMultiplier = '\x01';
      }
      TPZGeoMesh::ResetReference(local_78);
      for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
        this_03 = TPZCompMesh::Element(this_01,lVar11);
        pTVar7 = TPZCompEl::Reference(this_03);
        local_84 = pTVar7->fMatId;
        iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&local_68->_M_t,(key_type *)&local_84);
        if (iVar9._M_node != local_70) {
          TPZMHMeshControl::SetSubdomain
                    (&local_80->super_TPZMHMeshControl,this_03,
                     (local_80->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore
                     [pTVar7->fIndex]);
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_60);
      return;
    }
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(this_01->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
    if (*ppTVar6 == (TPZCompEl *)0x0) break;
    this_02 = (TPZCompElDisc *)
              __dynamic_cast(*ppTVar6,&TPZCompEl::typeinfo,&TPZCompElDisc::typeinfo,0);
    if (this_02 == (TPZCompElDisc *)0x0) break;
    pTVar7 = TPZCompEl::Reference((TPZCompEl *)this_02);
    iVar3 = (**(code **)(*(long *)pTVar7 + 0x210))(pTVar7);
    if (iVar3 != iVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                 ,0x1b6);
    }
    TPZCompElDisc::SetTotalOrderShape(this_02);
    TPZCompElDisc::SetFalseUseQsiEta(this_02);
    lVar11 = lVar11 + 1;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x1b3);
}

Assistant:

void TPZMHMixedMeshControl::CreateRotationMesh()
{
    TPZGeoMesh * gmesh = fGMesh.operator->();
    gmesh->ResetReference();
    int porder = fpOrderInternal;
    TPZCompMesh * cmeshRotation = fRotationMesh.operator->();
    gmesh->ResetReference();
    cmeshRotation->SetName("RotationMesh");
    cmeshRotation->SetDimModel(gmesh->Dimension());
    cmeshRotation->ApproxSpace().SetAllCreateFunctionsDiscontinuous();
    cmeshRotation->SetDefaultOrder(porder);
    
    int meshdim = cmeshRotation->Dimension();
    std::set<int> matids;
    for (auto it:fMaterialIds) {
        TPZMaterial *mat = cmeshRotation->FindMaterial(it);
        if (mat && mat->Dimension() == meshdim) {
            matids.insert(it);
        }
    }
    cmeshRotation->AutoBuild(matids);
    fRotationMesh->ExpandSolution();
    
    if(0)
    {
        std::ofstream out("RotationsMesh.txt");
        fPressureFineMesh->Print(out);
    }

    
    int64_t nel = cmeshRotation->NElements();
    for(int64_t i=0; i<nel; i++){
        TPZCompEl *cel = cmeshRotation->ElementVec()[i];
        TPZCompElDisc *celdisc = dynamic_cast<TPZCompElDisc *>(cel);
        if(!celdisc) DebugStop();
        if(celdisc && celdisc->Reference()->Dimension() != meshdim)
        {
            DebugStop();
        }
        celdisc->SetTotalOrderShape();
        celdisc->SetFalseUseQsiEta();
    }
    
    int64_t nc = cmeshRotation->NConnects();
    for (int64_t ic=0; ic<nc; ic++) {
        cmeshRotation->ConnectVec()[ic].SetLagrangeMultiplier(1);
    }
    gmesh->ResetReference();
    
    for (int64_t el=0; el<nel; el++)
    {
        TPZCompEl *cel = cmeshRotation->Element(el);
#ifdef PZDEBUG
        if (! cel) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        if(fMaterialIds.find (gel->MaterialId()) == fMaterialIds.end())
        {
            continue;
        }
#ifdef PZDEBUG
        if (fGeoToMHMDomain[gel->Index()] == -1) {
            DebugStop();
        }
#endif
        
        SetSubdomain(cel, fGeoToMHMDomain[gel->Index()]);
    }
    
    
    return;
}